

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O2

bool btGjkEpaSolver2::Penetration
               (btConvexShape *shape0,btTransform *wtrs0,btConvexShape *shape1,btTransform *wtrs1,
               btVector3 *guess,sResults *results,bool usemargins)

{
  undefined1 auVar1 [16];
  _ _Var2;
  _ _Var3;
  code *pcVar4;
  long *plVar5;
  U i;
  ulong uVar6;
  float fVar7;
  float fVar9;
  undefined8 uVar8;
  float fVar10;
  float extraout_XMM0_Dc;
  float fVar11;
  float extraout_XMM0_Dd;
  float fVar12;
  btVector3 bVar13;
  tShape shape;
  GJK gjk;
  EPA epa;
  btVector3 local_3b38;
  float local_3b28;
  float fStack_3b24;
  float fStack_3b20;
  float fStack_3b1c;
  btVector3 local_3b18;
  tShape local_3b08;
  GJK local_3a78;
  EPA local_38a8;
  
  gjkepa2_impl::Initialize(shape0,wtrs0,shape1,wtrs1,results,&local_3b08,usemargins);
  local_3a78.m_nfree = 0;
  local_3a78.m_current = 0;
  local_3a78.m_ray.m_floats[0] = 0.0;
  local_3a78.m_ray.m_floats[1] = 0.0;
  local_3a78.m_ray.m_floats[2] = 0.0;
  local_3a78.m_ray.m_floats[3] = 0.0;
  local_3a78.m_status = Failed;
  local_3a78.m_distance = 0.0;
  local_38a8._0_16_ = operator-(guess);
  _Var2 = gjkepa2_impl::GJK::Evaluate(&local_3a78,&local_3b08,(btVector3 *)&local_38a8);
  if (_Var2 == Failed) {
    results->status = GJK_Failed;
  }
  else if (_Var2 == Inside) {
    gjkepa2_impl::EPA::EPA(&local_38a8);
    local_3b38 = operator-(guess);
    _Var3 = gjkepa2_impl::EPA::Evaluate(&local_38a8,&local_3a78,&local_3b38);
    if (_Var3 != Failed) {
      fVar7 = 0.0;
      fVar9 = 0.0;
      fVar10 = 0.0;
      fVar11 = 0.0;
      local_3b38.m_floats = (btScalar  [4])ZEXT816(0);
      fVar12 = 0.0;
      for (uVar6 = 0; uVar6 < local_38a8.m_result.rank; uVar6 = uVar6 + 1) {
        plVar5 = (long *)((long)&(local_3b08.m_shapes[0]->super_btCollisionShape).
                                 _vptr_btCollisionShape + local_3b08._136_8_);
        pcVar4 = (code *)local_3b08.Ls;
        if ((local_3b08.Ls & 1) != 0) {
          pcVar4 = *(code **)(local_3b08.Ls + *plVar5 + -1);
        }
        local_3b28 = fVar7;
        fStack_3b24 = fVar9;
        fStack_3b20 = fVar10;
        fStack_3b1c = fVar11;
        fVar7 = fVar12;
        uVar8 = (*pcVar4)(plVar5,*(undefined8 *)((long)&local_38a8 + uVar6 * 8 + 8));
        bVar13.m_floats = local_3b38.m_floats;
        fVar11 = *(float *)((long)&local_38a8 + uVar6 * 4 + 0x28);
        fVar12 = fVar12 + fVar7 * fVar11;
        fVar7 = local_3b28 + fVar11 * (float)uVar8;
        fVar9 = fStack_3b24 + fVar11 * (float)((ulong)uVar8 >> 0x20);
        fVar10 = fStack_3b20 + fVar11 * extraout_XMM0_Dc;
        fVar11 = fStack_3b1c + fVar11 * extraout_XMM0_Dd;
        local_3b38.m_floats[1] = fVar9;
        local_3b38.m_floats[0] = fVar7;
        local_3b38.m_floats[3] = bVar13.m_floats[3];
        local_3b38.m_floats[2] = fVar12;
      }
      results->status = Penetrating;
      bVar13 = btTransform::operator()(wtrs0,&local_3b38);
      *&results->witnesses[0].m_floats = bVar13.m_floats;
      local_3b18.m_floats[1] =
           local_3b38.m_floats[1] - local_38a8.m_normal.m_floats[1] * local_38a8.m_depth;
      local_3b18.m_floats[0] =
           local_3b38.m_floats[0] - local_38a8.m_depth * local_38a8.m_normal.m_floats[0];
      local_3b18.m_floats[2] =
           local_3b38.m_floats[2] - local_38a8.m_normal.m_floats[2] * local_38a8.m_depth;
      local_3b18.m_floats[3] = 0.0;
      bVar13 = btTransform::operator()(wtrs0,&local_3b18);
      *&results->witnesses[1].m_floats = bVar13.m_floats;
      auVar1._8_4_ = -local_38a8.m_normal.m_floats[2];
      auVar1._0_8_ = CONCAT44(local_38a8.m_normal.m_floats[1],local_38a8.m_normal.m_floats[0]) ^
                     0x8000000080000000;
      auVar1._12_4_ = 0;
      *(undefined1 (*) [16])(results->normal).m_floats = auVar1;
      results->distance = -local_38a8.m_depth;
      return true;
    }
    results->status = EPA_Failed;
  }
  return false;
}

Assistant:

bool	btGjkEpaSolver2::Penetration(	const btConvexShape*	shape0,
									 const btTransform&		wtrs0,
									 const btConvexShape*	shape1,
									 const btTransform&		wtrs1,
									 const btVector3&		guess,
									 sResults&				results,
									 bool					usemargins)
{
	tShape			shape;
	Initialize(shape0,wtrs0,shape1,wtrs1,results,shape,usemargins);
	GJK				gjk;	
	GJK::eStatus::_	gjk_status=gjk.Evaluate(shape,-guess);
	switch(gjk_status)
	{
	case	GJK::eStatus::Inside:
		{
			EPA				epa;
			EPA::eStatus::_	epa_status=epa.Evaluate(gjk,-guess);
			if(epa_status!=EPA::eStatus::Failed)
			{
				btVector3	w0=btVector3(0,0,0);
				for(U i=0;i<epa.m_result.rank;++i)
				{
					w0+=shape.Support(epa.m_result.c[i]->d,0)*epa.m_result.p[i];
				}
				results.status			=	sResults::Penetrating;
				results.witnesses[0]	=	wtrs0*w0;
				results.witnesses[1]	=	wtrs0*(w0-epa.m_normal*epa.m_depth);
				results.normal			=	-epa.m_normal;
				results.distance		=	-epa.m_depth;
				return(true);
			} else results.status=sResults::EPA_Failed;
		}
		break;
	case	GJK::eStatus::Failed:
		results.status=sResults::GJK_Failed;
		break;
		default:
					{
					}
	}
	return(false);
}